

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd64_transform_kernel_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  uint uVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int *piVar19;
  long lVar20;
  long lVar21;
  int i;
  int iVar22;
  long lVar23;
  int k;
  undefined4 *puVar24;
  long lVar25;
  undefined4 *puVar26;
  long lVar27;
  undefined4 *puVar28;
  long lVar29;
  ulong uVar30;
  undefined8 *puVar31;
  undefined4 *puVar32;
  ulong uVar33;
  int j;
  long lVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar45 [16];
  undefined8 uVar44;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float tmp [8] [3];
  Mat local_e8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  local_e8.cstep = 0;
  local_e8.data = (undefined4 *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,0x40,inch,outch,4,(Allocator *)0x0);
  if (0 < outch) {
    pvVar8 = kernel->data;
    auVar11 = vblendps_avx(_DAT_00314c80,_DAT_00314ca0,0x92);
    auVar11 = vblendps_avx(auVar11,_DAT_00314cc0,0x24);
    auVar13 = vpermps_avx2(_DAT_00314d80,auVar11);
    auVar11 = vblendps_avx(_DAT_00314c80,_DAT_00314ca0,0x24);
    auVar11 = vblendps_avx(auVar11,_DAT_00314cc0,0x49);
    auVar14 = vpermps_avx2(_DAT_00314da0,auVar11);
    auVar11 = vblendps_avx(_DAT_00314ca0,_DAT_00314c80,0x24);
    auVar15 = vpermps_avx2(_DAT_00314dc0,auVar11);
    auVar11 = vshufps_avx(_DAT_00314cc0,_DAT_00314cc0,0xc4);
    auVar11 = vpermpd_avx2(auVar11,0xc4);
    auVar11 = vblendps_avx(auVar15,auVar11,0xe0);
    uVar30 = 0;
    puVar26 = (undefined4 *)local_e8.data;
    do {
      if (0 < inch) {
        iVar22 = inch * 9 * (int)uVar30;
        uVar33 = 0;
        puVar32 = puVar26;
        do {
          fVar1 = *(float *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4);
          uVar2 = *(undefined4 *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 4);
          auVar42._4_4_ = uVar2;
          auVar42._0_4_ = uVar2;
          auVar42._8_4_ = uVar2;
          auVar42._12_4_ = uVar2;
          auVar42._16_4_ = uVar2;
          auVar42._20_4_ = uVar2;
          auVar42._24_4_ = uVar2;
          auVar42._28_4_ = uVar2;
          uVar3 = *(undefined4 *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 8);
          auVar46._4_4_ = uVar3;
          auVar46._0_4_ = uVar3;
          auVar46._8_4_ = uVar3;
          auVar46._12_4_ = uVar3;
          auVar46._16_4_ = uVar3;
          auVar46._20_4_ = uVar3;
          auVar46._24_4_ = uVar3;
          auVar46._28_4_ = uVar3;
          fVar4 = *(float *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 0xc);
          uVar5 = *(undefined4 *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 0x10);
          auVar47._4_4_ = uVar5;
          auVar47._0_4_ = uVar5;
          auVar47._8_4_ = uVar5;
          auVar47._12_4_ = uVar5;
          auVar47._16_4_ = uVar5;
          auVar47._20_4_ = uVar5;
          auVar47._24_4_ = uVar5;
          auVar47._28_4_ = uVar5;
          uVar5 = *(undefined4 *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 0x14);
          auVar49._4_4_ = uVar5;
          auVar49._0_4_ = uVar5;
          auVar49._8_4_ = uVar5;
          auVar49._12_4_ = uVar5;
          auVar49._16_4_ = uVar5;
          auVar49._20_4_ = uVar5;
          auVar49._24_4_ = uVar5;
          auVar49._28_4_ = uVar5;
          fVar6 = *(float *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 0x18);
          uVar5 = *(undefined4 *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 0x1c);
          auVar50._4_4_ = uVar5;
          auVar50._0_4_ = uVar5;
          auVar50._8_4_ = uVar5;
          auVar50._12_4_ = uVar5;
          auVar50._16_4_ = uVar5;
          auVar50._20_4_ = uVar5;
          auVar50._24_4_ = uVar5;
          auVar50._28_4_ = uVar5;
          uVar5 = *(undefined4 *)((long)pvVar8 + uVar33 * 0x24 + (long)iVar22 * 4 + 0x20);
          auVar51._4_4_ = uVar5;
          auVar51._0_4_ = uVar5;
          auVar51._8_4_ = uVar5;
          auVar51._12_4_ = uVar5;
          auVar51._16_4_ = uVar5;
          auVar51._20_4_ = uVar5;
          auVar51._24_4_ = uVar5;
          auVar51._28_4_ = uVar5;
          fVar35 = auVar13._0_4_;
          fVar36 = auVar13._4_4_;
          auVar15._4_4_ = fVar36 * fVar1;
          auVar15._0_4_ = fVar35 * fVar1;
          fVar37 = auVar13._8_4_;
          auVar15._8_4_ = fVar37 * fVar1;
          fVar38 = auVar13._12_4_;
          auVar15._12_4_ = fVar38 * fVar1;
          fVar39 = auVar13._16_4_;
          auVar15._16_4_ = fVar39 * fVar1;
          fVar40 = auVar13._20_4_;
          auVar15._20_4_ = fVar40 * fVar1;
          fVar41 = auVar13._24_4_;
          auVar15._24_4_ = fVar41 * fVar1;
          auVar15._28_4_ = fVar1;
          auVar45 = vfmadd231ps_fma(auVar15,auVar14,auVar42);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar11,auVar46);
          auVar12._4_4_ = fVar4 * fVar36;
          auVar12._0_4_ = fVar4 * fVar35;
          auVar12._8_4_ = fVar4 * fVar37;
          auVar12._12_4_ = fVar4 * fVar38;
          auVar12._16_4_ = fVar4 * fVar39;
          auVar12._20_4_ = fVar4 * fVar40;
          auVar12._24_4_ = fVar4 * fVar41;
          auVar12._28_4_ = uVar2;
          auVar45 = vfmadd231ps_fma(auVar12,auVar14,auVar47);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar11,auVar49);
          auVar43._4_4_ = fVar6 * fVar36;
          auVar43._0_4_ = fVar6 * fVar35;
          auVar43._8_4_ = fVar6 * fVar37;
          auVar43._12_4_ = fVar6 * fVar38;
          auVar43._16_4_ = fVar6 * fVar39;
          auVar43._20_4_ = fVar6 * fVar40;
          auVar43._24_4_ = fVar6 * fVar41;
          auVar43._28_4_ = uVar3;
          auVar45 = vfmadd231ps_fma(auVar43,auVar14,auVar50);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar11,auVar51);
          auVar15 = vpermpd_avx2(ZEXT1632(auVar16),0x60);
          auVar45 = vshufps_avx(auVar17,auVar17,0xa1);
          auVar12 = vpermpd_avx2(ZEXT1632(auVar45),0x44);
          auVar15 = vblendps_avx(auVar15,auVar12,0x92);
          uVar44 = auVar18._0_8_;
          auVar48._8_8_ = uVar44;
          auVar48._0_8_ = uVar44;
          auVar48._16_8_ = uVar44;
          auVar48._24_8_ = uVar44;
          local_98 = vblendps_avx(auVar15,auVar48,0x24);
          auVar12 = vpermpd_avx2(ZEXT1632(auVar16),0xff);
          auVar43 = ZEXT1632(auVar17);
          auVar15 = vshufps_avx(auVar43,auVar43,0xf9);
          auVar15 = vpermpd_avx2(auVar15,0xea);
          auVar15 = vblendps_avx(auVar15,auVar12,0x24);
          auVar42 = ZEXT1632(auVar18);
          auVar12 = vpermpd_avx2(auVar42,0xf6);
          local_58 = vblendps_avx(auVar15,auVar12,0x92);
          auVar12 = vshufps_avx(auVar43,auVar43,0xf0);
          auVar15 = vshufpd_avx(ZEXT1632(auVar16),ZEXT1632(auVar16),1);
          auVar15 = vblendps_avx(auVar15,auVar12,0x24);
          auVar12 = vshufpd_avx(auVar42,auVar42,3);
          local_78 = vblendps_avx(auVar15,auVar12,0x49);
          lVar34 = 0;
          puVar24 = puVar32;
          do {
            uVar7 = *(uint *)(local_98 + lVar34 * 0xc);
            uVar44 = *(undefined8 *)(local_98 + lVar34 * 0xc + 4);
            puVar31 = &DAT_00314c84;
            lVar23 = 0;
            do {
              auVar45._0_4_ = (float)*puVar31 * (float)uVar44;
              auVar45._4_4_ = (float)((ulong)*puVar31 >> 0x20) * (float)((ulong)uVar44 >> 0x20);
              auVar45._8_8_ = 0;
              auVar16 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar31 + -4)),auVar45,
                                        ZEXT416(uVar7));
              auVar45 = vmovshdup_avx(auVar45);
              puVar24[lVar23] = auVar16._0_4_ + auVar45._0_4_;
              lVar23 = lVar23 + 1;
              puVar31 = (undefined8 *)((long)puVar31 + 0xc);
            } while (lVar23 != 8);
            lVar34 = lVar34 + 1;
            puVar24 = puVar24 + 8;
          } while (lVar34 != 8);
          uVar33 = uVar33 + 1;
          puVar32 = (undefined4 *)
                    ((long)puVar32 +
                    (long)local_e8.w *
                    CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar33 != (uint)inch);
      }
      uVar30 = uVar30 + 1;
      puVar26 = (undefined4 *)
                ((long)puVar26 +
                local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar30 != (uint)outch);
  }
  Mat::create(kernel_tm_pack8,(uint)inch >> 3,0x40,(uint)outch >> 3,0x100,0x40,(Allocator *)0x0);
  if (7 < outch) {
    lVar34 = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
    lVar27 = lVar34 * local_e8.cstep;
    iVar22 = kernel_tm_pack8->w;
    pvVar8 = kernel_tm_pack8->data;
    sVar9 = kernel_tm_pack8->elemsize;
    sVar10 = kernel_tm_pack8->cstep;
    lVar23 = (local_e8.cstep * -7 + (long)local_e8.w) * lVar34;
    uVar30 = 0;
    puVar26 = (undefined4 *)local_e8.data;
    do {
      lVar25 = 0;
      puVar32 = puVar26;
      do {
        if (7 < inch) {
          puVar28 = (undefined4 *)
                    ((long)pvVar8 + (long)iVar22 * sVar9 * lVar25 + (uVar30 >> 3) * sVar10 * sVar9);
          lVar29 = 7;
          puVar24 = puVar32;
          do {
            *puVar28 = *puVar24;
            puVar28[1] = *(undefined4 *)((long)puVar24 + lVar27);
            puVar28[2] = *(undefined4 *)((long)puVar24 + lVar27 * 2);
            puVar28[3] = *(undefined4 *)((long)puVar24 + lVar27 * 3);
            puVar28[4] = puVar24[lVar27];
            puVar28[5] = *(undefined4 *)((long)puVar24 + lVar27 * 5);
            puVar28[6] = *(undefined4 *)((long)puVar24 + lVar27 * 6);
            puVar28[7] = *(undefined4 *)((long)puVar24 + lVar27 * 7);
            lVar20 = lVar23 + lVar27 * 7;
            puVar28[8] = *(undefined4 *)((long)puVar24 + lVar23 + lVar27 * 7);
            lVar21 = lVar27 + lVar20;
            puVar28[9] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[10] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0xb] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0xc] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0xd] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0xe] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0xf] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar23 + lVar21;
            puVar28[0x10] = *(undefined4 *)((long)puVar24 + lVar23 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x11] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x12] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x13] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x14] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x15] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x16] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x17] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar23 + lVar21;
            puVar28[0x18] = *(undefined4 *)((long)puVar24 + lVar23 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x19] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x1a] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x1b] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x1c] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x1d] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x1e] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x1f] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar23 + lVar21;
            puVar28[0x20] = *(undefined4 *)((long)puVar24 + lVar23 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x21] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x22] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x23] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x24] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x25] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x26] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x27] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar23 + lVar21;
            puVar28[0x28] = *(undefined4 *)((long)puVar24 + lVar23 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x29] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x2a] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x2b] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x2c] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x2d] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x2e] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x2f] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar23 + lVar21;
            puVar28[0x30] = *(undefined4 *)((long)puVar24 + lVar23 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x31] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x32] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x33] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x34] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x35] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x36] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x37] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar23 + lVar21;
            puVar28[0x38] = *(undefined4 *)((long)puVar24 + lVar23 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x39] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x3a] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x3b] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            lVar20 = lVar27 + lVar21;
            puVar28[0x3c] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            lVar21 = lVar27 + lVar20;
            puVar28[0x3d] = *(undefined4 *)((long)puVar24 + lVar27 + lVar20);
            puVar28[0x3e] = *(undefined4 *)((long)puVar24 + lVar27 + lVar21);
            puVar28[0x3f] = *(undefined4 *)((long)puVar24 + lVar27 * 2 + lVar21);
            puVar28 = puVar28 + 0x40;
            puVar24 = puVar24 + lVar34 * local_e8.w * 2;
            lVar29 = lVar29 + 8;
          } while (lVar29 < inch);
        }
        lVar25 = lVar25 + 1;
        puVar32 = puVar32 + 1;
      } while (lVar25 != 0x40);
      uVar30 = uVar30 + 8;
      puVar26 = puVar26 + lVar27 * 2;
    } while ((int)((uint)uVar30 | 7) < outch);
  }
  piVar19 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_e8.data != (undefined4 *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd64_transform_kernel_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
    // interleave
    // src = 64-inch-outch
    // dst = 8b-8a-inch/8a-64-outch/8b;
    kernel_tm_pack8.create(inch / 8, 64, outch / 8, (size_t)4u * 64, 64);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel_tm.channel(q);
        const Mat k1 = kernel_tm.channel(q + 1);
        const Mat k2 = kernel_tm.channel(q + 2);
        const Mat k3 = kernel_tm.channel(q + 3);
        const Mat k4 = kernel_tm.channel(q + 4);
        const Mat k5 = kernel_tm.channel(q + 5);
        const Mat k6 = kernel_tm.channel(q + 6);
        const Mat k7 = kernel_tm.channel(q + 7);

        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                const float* k00 = k0.row(p);
                const float* k01 = k0.row(p + 1);
                const float* k02 = k0.row(p + 2);
                const float* k03 = k0.row(p + 3);
                const float* k04 = k0.row(p + 4);
                const float* k05 = k0.row(p + 5);
                const float* k06 = k0.row(p + 6);
                const float* k07 = k0.row(p + 7);

                const float* k10 = k1.row(p);
                const float* k11 = k1.row(p + 1);
                const float* k12 = k1.row(p + 2);
                const float* k13 = k1.row(p + 3);
                const float* k14 = k1.row(p + 4);
                const float* k15 = k1.row(p + 5);
                const float* k16 = k1.row(p + 6);
                const float* k17 = k1.row(p + 7);

                const float* k20 = k2.row(p);
                const float* k21 = k2.row(p + 1);
                const float* k22 = k2.row(p + 2);
                const float* k23 = k2.row(p + 3);
                const float* k24 = k2.row(p + 4);
                const float* k25 = k2.row(p + 5);
                const float* k26 = k2.row(p + 6);
                const float* k27 = k2.row(p + 7);

                const float* k30 = k3.row(p);
                const float* k31 = k3.row(p + 1);
                const float* k32 = k3.row(p + 2);
                const float* k33 = k3.row(p + 3);
                const float* k34 = k3.row(p + 4);
                const float* k35 = k3.row(p + 5);
                const float* k36 = k3.row(p + 6);
                const float* k37 = k3.row(p + 7);

                const float* k40 = k4.row(p);
                const float* k41 = k4.row(p + 1);
                const float* k42 = k4.row(p + 2);
                const float* k43 = k4.row(p + 3);
                const float* k44 = k4.row(p + 4);
                const float* k45 = k4.row(p + 5);
                const float* k46 = k4.row(p + 6);
                const float* k47 = k4.row(p + 7);

                const float* k50 = k5.row(p);
                const float* k51 = k5.row(p + 1);
                const float* k52 = k5.row(p + 2);
                const float* k53 = k5.row(p + 3);
                const float* k54 = k5.row(p + 4);
                const float* k55 = k5.row(p + 5);
                const float* k56 = k5.row(p + 6);
                const float* k57 = k5.row(p + 7);

                const float* k60 = k6.row(p);
                const float* k61 = k6.row(p + 1);
                const float* k62 = k6.row(p + 2);
                const float* k63 = k6.row(p + 3);
                const float* k64 = k6.row(p + 4);
                const float* k65 = k6.row(p + 5);
                const float* k66 = k6.row(p + 6);
                const float* k67 = k6.row(p + 7);

                const float* k70 = k7.row(p);
                const float* k71 = k7.row(p + 1);
                const float* k72 = k7.row(p + 2);
                const float* k73 = k7.row(p + 3);
                const float* k74 = k7.row(p + 4);
                const float* k75 = k7.row(p + 5);
                const float* k76 = k7.row(p + 6);
                const float* k77 = k7.row(p + 7);

                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00[8] = k01[k];
                g00[9] = k11[k];
                g00[10] = k21[k];
                g00[11] = k31[k];
                g00[12] = k41[k];
                g00[13] = k51[k];
                g00[14] = k61[k];
                g00[15] = k71[k];

                g00[16] = k02[k];
                g00[17] = k12[k];
                g00[18] = k22[k];
                g00[19] = k32[k];
                g00[20] = k42[k];
                g00[21] = k52[k];
                g00[22] = k62[k];
                g00[23] = k72[k];

                g00[24] = k03[k];
                g00[25] = k13[k];
                g00[26] = k23[k];
                g00[27] = k33[k];
                g00[28] = k43[k];
                g00[29] = k53[k];
                g00[30] = k63[k];
                g00[31] = k73[k];

                g00[32] = k04[k];
                g00[33] = k14[k];
                g00[34] = k24[k];
                g00[35] = k34[k];
                g00[36] = k44[k];
                g00[37] = k54[k];
                g00[38] = k64[k];
                g00[39] = k74[k];

                g00[40] = k05[k];
                g00[41] = k15[k];
                g00[42] = k25[k];
                g00[43] = k35[k];
                g00[44] = k45[k];
                g00[45] = k55[k];
                g00[46] = k65[k];
                g00[47] = k75[k];

                g00[48] = k06[k];
                g00[49] = k16[k];
                g00[50] = k26[k];
                g00[51] = k36[k];
                g00[52] = k46[k];
                g00[53] = k56[k];
                g00[54] = k66[k];
                g00[55] = k76[k];

                g00[56] = k07[k];
                g00[57] = k17[k];
                g00[58] = k27[k];
                g00[59] = k37[k];
                g00[60] = k47[k];
                g00[61] = k57[k];
                g00[62] = k67[k];
                g00[63] = k77[k];

                g00 += 64;
            }
        }
    }
}